

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O0

void Gia_ManTisCollectMffc(Gia_Man_t *p,int Id,Vec_Int_t *vMffc,Vec_Int_t *vLeaves)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vMffc_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,Id);
  iVar1 = Gia_ObjIsAnd(pObj_00);
  if (iVar1 != 0) {
    Vec_IntClear(vMffc);
    Vec_IntClear(vLeaves);
    Gia_ManIncrementTravId(p);
    iVar1 = Gia_ObjFaninId0(pObj_00,Id);
    Gia_ManTisCollectMffc_rec(p,iVar1,vMffc,vLeaves);
    iVar1 = Gia_ObjFaninId1(pObj_00,Id);
    Gia_ManTisCollectMffc_rec(p,iVar1,vMffc,vLeaves);
    iVar1 = Gia_ObjIsMuxId(p,Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId2(p,Id);
      Gia_ManTisCollectMffc_rec(p,iVar1,vMffc,vLeaves);
    }
    Vec_IntPush(vMffc,Id);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTis.c"
                ,0x7e,"void Gia_ManTisCollectMffc(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManTisCollectMffc( Gia_Man_t * p, int Id, Vec_Int_t * vMffc, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Id );
    assert( Gia_ObjIsAnd(pObj) );
    Vec_IntClear( vMffc );
    Vec_IntClear( vLeaves );
    Gia_ManIncrementTravId( p );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId0(pObj, Id), vMffc, vLeaves );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId1(pObj, Id), vMffc, vLeaves );
    if ( Gia_ObjIsMuxId(p, Id) )
        Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId2(p, Id), vMffc, vLeaves );
    Vec_IntPush( vMffc, Id );
}